

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O3

void __thiscall
iu_MatcherFailure_x_iutest_x_FloatNear_Test::Body(iu_MatcherFailure_x_iutest_x_FloatNear_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestFlag TVar3;
  TestPartResultReporterInterface *pTVar4;
  TestFlag *pTVar5;
  Variable *pVVar6;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  AssertionResult iutest_spi_ar;
  AssertionResult iutest_ar;
  SPIFailureChecker iutest_failure_checker;
  TestFlag local_440;
  FInt local_43c;
  detail *local_438;
  long local_428 [2];
  string local_418;
  AssertionResult local_3f8;
  AssertionResult local_3d0;
  AssertionHelper local_3a8;
  SPIFailureChecker local_378;
  undefined1 local_340 [8];
  undefined8 local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  FInt local_1b8;
  undefined4 uStack_1b4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  char *local_198;
  undefined8 local_190;
  ios_base local_138 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c1e8;
  local_378.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_440);
  local_340 = (undefined1  [8])&PTR__IMatcher_0023bea8;
  local_338 = CONCAT44((anonymous_namespace)::f0.iv,(FInt)0x3f800000);
  iutest::detail::FloatingPointNearMatcher<float>::operator()
            (&local_3d0,(FloatingPointNearMatcher<float> *)local_340,
             (float *)&(anonymous_namespace)::f0);
  if (local_3d0.m_result == false) {
    memset(&local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1b8);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::ostream::_M_insert<double>((double)(anonymous_namespace)::f0.fv);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_418,local_438,"FloatNear(1.0f, f0)",(char *)&local_3d0,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_418._M_dataplus._M_p,(allocator<char> *)local_340);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x20f;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)&local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
    }
    if (local_438 != (detail *)local_428) {
      operator_delete(local_438,local_428[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar2 = &local_3d0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  TVar3.m_test_flags = local_440.m_test_flags;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = TVar3.m_test_flags;
  local_330[0]._M_allocated_capacity._0_4_ = 0x7261654e;
  local_330[0]._M_allocated_capacity._4_2_ = 0x203a;
  local_338 = 6;
  local_330[0]._M_local_buf[6] = '\0';
  local_340 = (undefined1  [8])local_330;
  iutest::detail::SPIFailureChecker::GetResult(&local_3f8,&local_378,(string *)local_340);
  if (local_340 != (undefined1  [8])local_330) {
    operator_delete((void *)local_340,
                    CONCAT17(local_330[0]._M_local_buf[7],
                             CONCAT16(local_330[0]._M_local_buf[6],
                                      CONCAT24(local_330[0]._M_allocated_capacity._4_2_,
                                               (undefined4)local_330[0]._M_allocated_capacity))) + 1
                   );
  }
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c268;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar4 = local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023c290;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar4;
  if (local_3f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_340,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,local_3f8.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_378);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = 0x10000020f;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1b8,(Fixed *)local_340,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_1b4,local_1b8.iv) != &local_1a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_1b4,local_1b8.iv),local_1a8._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  paVar1 = &local_3f8.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8.m_message._M_dataplus._M_p,
                    local_3f8.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c1e8;
  local_378.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_440);
  local_1b8.fv = 0.0 / (anonymous_namespace)::f0.fv;
  local_340 = (undefined1  [8])&PTR__IMatcher_0023bea8;
  local_338 = CONCAT44(1.0,local_1b8.iv);
  iutest::detail::FloatingPointNearMatcher<float>::operator()
            (&local_3d0,(FloatingPointNearMatcher<float> *)local_340,&local_1b8.fv);
  if (local_3d0.m_result == false) {
    memset(&local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1b8);
    local_43c.iv = (anonymous_namespace)::f0.iv;
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::ostream::_M_insert<double>((double)(0.0 / local_43c.fv));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_418,local_438,"FloatNear(0/f0, 1.0f)",(char *)&local_3d0,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_418._M_dataplus._M_p,(allocator<char> *)local_340);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x210;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)&local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
    }
    if (local_438 != (detail *)local_428) {
      operator_delete(local_438,local_428[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  TVar3.m_test_flags = local_440.m_test_flags;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = TVar3.m_test_flags;
  local_330[0]._M_allocated_capacity._0_4_ = 0x7261654e;
  local_330[0]._M_allocated_capacity._4_2_ = 0x203a;
  local_338 = 6;
  local_330[0]._M_local_buf[6] = '\0';
  local_340 = (undefined1  [8])local_330;
  iutest::detail::SPIFailureChecker::GetResult(&local_3f8,&local_378,(string *)local_340);
  if (local_340 != (undefined1  [8])local_330) {
    operator_delete((void *)local_340,
                    CONCAT17(local_330[0]._M_local_buf[7],
                             CONCAT16(local_330[0]._M_local_buf[6],
                                      CONCAT24(local_330[0]._M_allocated_capacity._4_2_,
                                               (undefined4)local_330[0]._M_allocated_capacity))) + 1
                   );
  }
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c268;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar4 = local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023c290;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar4;
  if (local_3f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_340,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,local_3f8.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_378);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = 0x100000210;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1b8,(Fixed *)local_340,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_1b4,local_1b8.iv) != &local_1a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_1b4,local_1b8.iv),local_1a8._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8.m_message._M_dataplus._M_p,
                    local_3f8.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c1e8;
  local_378.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_440);
  local_340 = (undefined1  [8])&PTR__IMatcher_0023bea8;
  local_338 = CONCAT44(1.0,(anonymous_namespace)::f0.iv);
  local_1b8.fv = 0.0 / (anonymous_namespace)::f0.fv;
  iutest::detail::FloatingPointNearMatcher<float>::operator()
            (&local_3d0,(FloatingPointNearMatcher<float> *)local_340,&local_1b8.fv);
  if (local_3d0.m_result == false) {
    memset(&local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1b8);
    local_43c.iv = (anonymous_namespace)::f0.iv;
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::ostream::_M_insert<double>((double)(0.0 / local_43c.fv));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_418,local_438,"FloatingPointNear(f0, 1.0f)",(char *)&local_3d0,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_418._M_dataplus._M_p,(allocator<char> *)local_340);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x211;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)&local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
    }
    if (local_438 != (detail *)local_428) {
      operator_delete(local_438,local_428[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = local_440.m_test_flags;
  local_330[0]._M_allocated_capacity._0_4_ = 0x7261654e;
  local_330[0]._M_allocated_capacity._4_2_ = 0x203a;
  local_338 = 6;
  local_330[0]._M_local_buf[6] = '\0';
  local_340 = (undefined1  [8])local_330;
  iutest::detail::SPIFailureChecker::GetResult(&local_3f8,&local_378,(string *)local_340);
  if (local_340 != (undefined1  [8])local_330) {
    operator_delete((void *)local_340,
                    CONCAT17(local_330[0]._M_local_buf[7],
                             CONCAT16(local_330[0]._M_local_buf[6],
                                      CONCAT24(local_330[0]._M_allocated_capacity._4_2_,
                                               (undefined4)local_330[0]._M_allocated_capacity))) + 1
                   );
  }
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c268;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023c290;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter =
       local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  if (local_3f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_340,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,local_3f8.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_378);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = 0x100000211;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1b8,(Fixed *)local_340,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_1b4,local_1b8.iv) != &local_1a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_1b4,local_1b8.iv),local_1a8._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8.m_message._M_dataplus._M_p,
                    local_3f8.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(MatcherFailure, FloatNear)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(f0, FloatNear(1.0f, f0)), "Near: " );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(0/f0, FloatNear(0/f0, 1.0f)), "Near: " );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(0/f0, FloatingPointNear(f0, 1.0f)), "Near: " );
}